

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ClassSpecifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassSpecifierSyntax,slang::syntax::ClassSpecifierSyntax_const&>
          (BumpAllocator *this,ClassSpecifierSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SyntaxKind SVar11;
  undefined4 uVar12;
  ClassSpecifierSyntax *pCVar13;
  
  pCVar13 = (ClassSpecifierSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClassSpecifierSyntax *)this->endPtr < pCVar13 + 1) {
    pCVar13 = (ClassSpecifierSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pCVar13 + 1);
  }
  (pCVar13->keyword).info = (args->keyword).info;
  SVar11 = (args->super_SyntaxNode).kind;
  uVar12 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar7 = (args->colon).kind;
  uVar8 = (args->colon).field_0x2;
  NVar9.raw = (args->colon).numFlags.raw;
  uVar10 = (args->colon).rawLen;
  TVar3 = (args->keyword).kind;
  uVar4 = (args->keyword).field_0x2;
  NVar5.raw = (args->keyword).numFlags.raw;
  uVar6 = (args->keyword).rawLen;
  (pCVar13->colon).info = (args->colon).info;
  (pCVar13->keyword).kind = TVar3;
  (pCVar13->keyword).field_0x2 = uVar4;
  (pCVar13->keyword).numFlags = (NumericTokenFlags)NVar5.raw;
  (pCVar13->keyword).rawLen = uVar6;
  (pCVar13->super_SyntaxNode).previewNode = pSVar2;
  (pCVar13->colon).kind = TVar7;
  (pCVar13->colon).field_0x2 = uVar8;
  (pCVar13->colon).numFlags = (NumericTokenFlags)NVar9.raw;
  (pCVar13->colon).rawLen = uVar10;
  (pCVar13->super_SyntaxNode).kind = SVar11;
  *(undefined4 *)&(pCVar13->super_SyntaxNode).field_0x4 = uVar12;
  (pCVar13->super_SyntaxNode).parent = pSVar1;
  return pCVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }